

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomFragmentOpTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::RandomFragmentOpCase::init(RandomFragmentOpCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  RenderTarget *pRVar2;
  PixelFormat *pPVar3;
  QuadRenderer *this_00;
  RenderContext *context;
  TextureLevel *pTVar4;
  ReferenceQuadRenderer *this_01;
  TextureFormat local_44;
  TextureFormat local_3c;
  TextureFormat local_34 [3];
  byte local_19;
  int local_18;
  int iStack_14;
  bool useRGB;
  int height;
  int width;
  RandomFragmentOpCase *this_local;
  
  _height = this;
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getWidth(pRVar2);
  iStack_14 = de::min<int>(iVar1,0x40);
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getHeight(pRVar2);
  local_18 = de::min<int>(iVar1,0x40);
  pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar3 = tcu::RenderTarget::getPixelFormat(pRVar2);
  local_19 = pPVar3->alphaBits == 0;
  this_00 = (QuadRenderer *)operator_new(0x20);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer(this_00,context,GLSL_VERSION_100_ES);
  this->m_renderer = this_00;
  pTVar4 = (TextureLevel *)operator_new(0x28);
  tcu::TextureFormat::TextureFormat(local_34,RGBA - (local_19 & 1),UNORM_INT8);
  tcu::TextureLevel::TextureLevel(pTVar4,local_34,iStack_14,local_18,1);
  this->m_refColorBuffer = pTVar4;
  pTVar4 = (TextureLevel *)operator_new(0x28);
  tcu::TextureFormat::TextureFormat(&local_3c,D,FLOAT);
  tcu::TextureLevel::TextureLevel(pTVar4,&local_3c,iStack_14,local_18,1);
  this->m_refDepthBuffer = pTVar4;
  pTVar4 = (TextureLevel *)operator_new(0x28);
  tcu::TextureFormat::TextureFormat(&local_44,S,UNSIGNED_INT32);
  tcu::TextureLevel::TextureLevel(pTVar4,&local_44,iStack_14,local_18,1);
  this->m_refStencilBuffer = pTVar4;
  this_01 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_01);
  this->m_refRenderer = this_01;
  this->m_iterNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void RandomFragmentOpCase::init (void)
{
	DE_ASSERT(!m_renderer && !m_refColorBuffer && !m_refDepthBuffer && !m_refStencilBuffer && !m_refRenderer);

	int		width	= de::min<int>(m_context.getRenderTarget().getWidth(), VIEWPORT_WIDTH);
	int		height	= de::min<int>(m_context.getRenderTarget().getHeight(), VIEWPORT_HEIGHT);
	bool	useRGB	= m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	m_renderer			= new gls::FragmentOpUtil::QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_100_ES);
	m_refColorBuffer	= new tcu::TextureLevel(tcu::TextureFormat(useRGB ? tcu::TextureFormat::RGB : tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);
	m_refDepthBuffer	= new tcu::TextureLevel(tcu::TextureFormat(tcu::TextureFormat::D, tcu::TextureFormat::FLOAT),			width, height);
	m_refStencilBuffer	= new tcu::TextureLevel(tcu::TextureFormat(tcu::TextureFormat::S, tcu::TextureFormat::UNSIGNED_INT32),	width, height);
	m_refRenderer		= new gls::FragmentOpUtil::ReferenceQuadRenderer();
	m_iterNdx			= 0;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}